

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.h
# Opt level: O3

void gmath::div<double>(Polynomial<double> *p,Polynomial<double> *d,Polynomial<double> *q,
                       Polynomial<double> *r)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  long local_40;
  
  q->used = 1;
  *q->c = 0.0;
  Polynomial<double>::operator=(r,p);
  iVar2 = p->used;
  uVar7 = d->used;
  uVar4 = iVar2 - uVar7;
  if (-1 < (int)uVar4) {
    iVar2 = iVar2 + ~uVar7;
    iVar5 = uVar4 - 2;
    uVar9 = ~(ulong)uVar4;
    local_40 = uVar9 * 8;
    uVar8 = (ulong)uVar4;
    do {
      lVar3 = (long)d->used + uVar8 + -1;
      dVar10 = 0.0;
      if (lVar3 < r->used) {
        dVar10 = r->c[lVar3];
      }
      Polynomial<double>::set(q,(int)uVar8,dVar10 / d->c[(long)d->used + -1]);
      iVar6 = d->used;
      if ((long)uVar8 < (long)((int)uVar8 + -1 + iVar6)) {
        lVar3 = (long)(iVar2 + iVar6);
        iVar6 = iVar6 + iVar5;
        do {
          dVar11 = 0.0;
          dVar10 = 0.0;
          if (lVar3 <= r->used) {
            dVar10 = r->c[lVar3 + -1];
          }
          if ((long)uVar8 < (long)q->used) {
            dVar11 = q->c[uVar8];
          }
          dVar12 = 0.0;
          if ((long)(uVar9 + lVar3) < (long)d->used) {
            dVar12 = *(double *)((long)d->c + lVar3 * 8 + local_40);
          }
          lVar3 = lVar3 + -1;
          Polynomial<double>::set(r,iVar6,dVar10 - dVar11 * dVar12);
          iVar6 = iVar6 + -1;
        } while ((long)uVar8 < lVar3);
      }
      iVar2 = iVar2 + -1;
      iVar5 = iVar5 + -1;
      local_40 = local_40 + 8;
      uVar9 = uVar9 + 1;
      bVar1 = 0 < (long)uVar8;
      uVar8 = uVar8 - 1;
    } while (bVar1);
    uVar7 = d->used;
    iVar2 = p->used;
  }
  if ((int)uVar7 <= iVar2) {
    iVar2 = uVar7 - 1;
    do {
      Polynomial<double>::set(r,iVar2,0.0);
      iVar2 = iVar2 + 1;
    } while (iVar2 < p->used);
  }
  return;
}

Assistant:

void div(const Polynomial<T> &p, const Polynomial<T> &d,
                           Polynomial<T> &q, Polynomial<T> &r)
{
  // initialisation

  q.init();
  r=p;

  // perform division

  for (int k=p.getDegree()-d.getDegree(); k>=0; k--)
  {
    q.set(k, r[d.getDegree()+k]/d[d.getDegree()]);

    for (int i=d.getDegree()+k-1; i>=k; i--)
    {
      r.set(i, r[i]-q[k]*d[i-k]);
    }
  }

  // set leading coefficients of working array zero

  for (int i=d.getDegree(); i<p.getDegree()+1; i++)
  {
    r.set(i, 0);
  }
}